

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O3

bool S2::VertexCrossing(S2Point *a,S2Point *b,S2Point *c,S2Point *d)

{
  double dVar1;
  double dVar2;
  long lVar3;
  S2Point *pSVar4;
  double *ap;
  bool bVar5;
  S2Point SStack_38;
  
  lVar3 = 0;
  do {
    dVar1 = *(double *)((long)a->c_ + lVar3);
    dVar2 = *(double *)((long)b->c_ + lVar3);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar5 = lVar3 != 0x10;
    lVar3 = lVar3 + 8;
  } while (bVar5);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    lVar3 = 0;
    do {
      dVar1 = *(double *)((long)c->c_ + lVar3);
      dVar2 = *(double *)((long)d->c_ + lVar3);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar5 = lVar3 != 0x10;
      lVar3 = lVar3 + 8;
    } while (bVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      lVar3 = 0;
      do {
        dVar1 = *(double *)((long)a->c_ + lVar3);
        dVar2 = *(double *)((long)c->c_ + lVar3);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        bVar5 = lVar3 != 0x10;
        lVar3 = lVar3 + 8;
      } while (bVar5);
      lVar3 = 0;
      pSVar4 = a;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        while( true ) {
          dVar1 = *(double *)((long)b->c_ + lVar3);
          dVar2 = *(double *)((long)d->c_ + lVar3);
          if (dVar1 != dVar2) break;
          if ((NAN(dVar1) || NAN(dVar2)) || (bVar5 = lVar3 == 0x10, lVar3 = lVar3 + 8, bVar5))
          break;
        }
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          lVar3 = 0;
          do {
            dVar1 = *(double *)((long)a->c_ + lVar3);
            dVar2 = *(double *)((long)d->c_ + lVar3);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar5 = lVar3 != 0x10;
            lVar3 = lVar3 + 8;
          } while (bVar5);
          lVar3 = 0;
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            while( true ) {
              dVar1 = *(double *)((long)b->c_ + lVar3);
              dVar2 = *(double *)((long)c->c_ + lVar3);
              if (dVar1 != dVar2) break;
              if ((NAN(dVar1) || NAN(dVar2)) || (bVar5 = lVar3 == 0x10, lVar3 = lVar3 + 8, bVar5))
              break;
            }
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&SStack_38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
                         ,0x61,kFatal,(ostream *)&std::cerr);
              std::operator<<((ostream *)SStack_38.c_[1],
                              "VertexCrossing called with 4 distinct vertices");
              abort();
            }
            Ortho(&SStack_38,b);
            pSVar4 = b;
            c = d;
          }
          else {
            do {
              dVar1 = *(double *)((long)b->c_ + lVar3);
              dVar2 = *(double *)((long)c->c_ + lVar3);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar5 = lVar3 != 0x10;
              lVar3 = lVar3 + 8;
            } while (bVar5);
            if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
              return true;
            }
            Ortho(&SStack_38,a);
            a = b;
          }
        }
        else {
          Ortho(&SStack_38,b);
          pSVar4 = b;
        }
      }
      else {
        do {
          dVar1 = *(double *)((long)b->c_ + lVar3);
          dVar2 = *(double *)((long)d->c_ + lVar3);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar5 = lVar3 != 0x10;
          lVar3 = lVar3 + 8;
        } while (bVar5);
        if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
          return true;
        }
        Ortho(&SStack_38,a);
        a = b;
        c = d;
      }
      bVar5 = s2pred::OrderedCCW(&SStack_38,c,a,pSVar4);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool VertexCrossing(const S2Point& a, const S2Point& b,
                    const S2Point& c, const S2Point& d) {
  // If A == B or C == D there is no intersection.  We need to check this
  // case first in case 3 or more input points are identical.
  if (a == b || c == d) return false;

  // If any other pair of vertices is equal, there is a crossing if and only
  // if OrderedCCW() indicates that the edge AB is further CCW around the
  // shared vertex O (either A or B) than the edge CD, starting from an
  // arbitrary fixed reference point.
  //
  // Optimization: if AB=CD or AB=DC, we can avoid most of the calculations.
  if (a == c) return (b == d) || s2pred::OrderedCCW(S2::Ortho(a), d, b, a);
  if (b == d) return s2pred::OrderedCCW(S2::Ortho(b), c, a, b);

  if (a == d) return (b == c) || s2pred::OrderedCCW(S2::Ortho(a), c, b, a);
  if (b == c) return s2pred::OrderedCCW(S2::Ortho(b), d, a, b);

  S2_LOG(DFATAL) << "VertexCrossing called with 4 distinct vertices";
  return false;
}